

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O0

FlatFilePos __thiscall
node::BlockManager::SaveBlockToDisk(BlockManager *this,CBlock *block,int nHeight)

{
  long lVar1;
  long *plVar2;
  string_view source_file;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  FlatFilePos FVar6;
  undefined4 in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  ParamsWrapper<TransactionSerParams,_const_CBlock> PVar7;
  uint nBlockSize;
  uint in_stack_00000094;
  FlatFilePos blockPos;
  char (*in_stack_000000b0) [16];
  undefined4 in_stack_fffffffffffffef8;
  undefined4 uVar8;
  undefined4 in_stack_fffffffffffffefc;
  CBlock *in_stack_ffffffffffffff00;
  TransactionSerParams *in_stack_ffffffffffffff08;
  char *in_stack_ffffffffffffff10;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff18;
  ConstevalStringLiteral in_stack_ffffffffffffff48;
  int source_line;
  ConstevalFormatString<1U> fmt;
  FlatFilePos in_stack_ffffffffffffffb0;
  BlockManager *in_stack_ffffffffffffffb8;
  string_view in_stack_ffffffffffffffc0;
  uint64_t in_stack_ffffffffffffffe0;
  uint in_stack_ffffffffffffffec;
  BlockManager *in_stack_fffffffffffffff0;
  
  source_line = (int)((ulong)in_RSI >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  PVar7 = TransactionSerParams::operator()(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  fmt.fmt = (char *)PVar7.m_object;
  sVar5 = GetSerializeSize<ParamsWrapper<TransactionSerParams,CBlock_const>>
                    ((ParamsWrapper<TransactionSerParams,_const_CBlock> *)in_stack_ffffffffffffff00)
  ;
  iVar4 = (int)sVar5 + 8;
  CBlockHeader::GetBlockTime
            ((CBlockHeader *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  FVar6 = FindNextBlockPos(in_stack_fffffffffffffff0,in_stack_ffffffffffffffec,in_stack_00000094,
                           in_stack_ffffffffffffffe0);
  bVar3 = FlatFilePos::IsNull((FlatFilePos *)
                              CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  if (bVar3) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    uVar8 = 4;
    source_file._M_str = (char *)in_stack_ffffffffffffffb8;
    source_file._M_len._0_4_ = in_stack_ffffffffffffffb0.nFile;
    source_file._M_len._4_4_ = in_stack_ffffffffffffffb0.nPos;
    LogPrintFormatInternal<char[16]>
              (in_stack_ffffffffffffffc0,source_file,source_line,CONCAT44(in_EDX,iVar4),
               blockPos.nFile,fmt,in_stack_000000b0);
    memset(&stack0xffffffffffffffb0,0,8);
    FlatFilePos::FlatFilePos((FlatFilePos *)CONCAT44(in_stack_fffffffffffffefc,uVar8));
    FVar6 = in_stack_ffffffffffffffb0;
  }
  else {
    bVar3 = WriteBlockToDisk(in_stack_ffffffffffffffb8,(CBlock *)in_stack_ffffffffffffffb0,
                             (FlatFilePos *)fmt.fmt);
    if (!bVar3) {
      plVar2 = *(long **)(in_RDI + 0x158);
      ::_(in_stack_ffffffffffffff48);
      (**(code **)(*plVar2 + 0x40))();
      bilingual_str::~bilingual_str
                ((bilingual_str *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      memset(&stack0xffffffffffffffb0,0,8);
      FlatFilePos::FlatFilePos
                ((FlatFilePos *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      FVar6 = in_stack_ffffffffffffffb0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return FVar6;
}

Assistant:

FlatFilePos BlockManager::SaveBlockToDisk(const CBlock& block, int nHeight)
{
    unsigned int nBlockSize = ::GetSerializeSize(TX_WITH_WITNESS(block));
    // Account for the 4 magic message start bytes + the 4 length bytes (8 bytes total,
    // defined as BLOCK_SERIALIZATION_HEADER_SIZE)
    nBlockSize += static_cast<unsigned int>(BLOCK_SERIALIZATION_HEADER_SIZE);
    FlatFilePos blockPos{FindNextBlockPos(nBlockSize, nHeight, block.GetBlockTime())};
    if (blockPos.IsNull()) {
        LogError("%s: FindNextBlockPos failed\n", __func__);
        return FlatFilePos();
    }
    if (!WriteBlockToDisk(block, blockPos)) {
        m_opts.notifications.fatalError(_("Failed to write block."));
        return FlatFilePos();
    }
    return blockPos;
}